

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

Model * gvr::loadDepth(char *name,char *spath,bool verbose)

{
  float fVar1;
  float *pfVar2;
  uint *puVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  pointer piVar7;
  pointer piVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  int iVar10;
  bool bVar11;
  char cVar12;
  int iVar13;
  ColoredMesh *this;
  reference pvVar14;
  uchar ***pppuVar15;
  long k_1;
  long lVar16;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar17;
  size_t i;
  ulong uVar18;
  long i_3;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_01;
  long i_00;
  int iVar19;
  int iVar20;
  long i_1;
  long lVar21;
  long lVar22;
  long lVar23;
  long k;
  size_type sVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  float fVar28;
  float local_184;
  vector<int,_std::allocator<int>_> *local_178;
  vector<int,_std::allocator<int>_> line0;
  Vector2d p;
  int f [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  vector<int,_std::allocator<int>_> line1;
  View view;
  long local_a8;
  long local_a0;
  Image<float,_gimage::PixelTraits<float>_> local_78 [8];
  size_type local_70;
  long local_68;
  long *local_48;
  long *local_40;
  float local_38;
  
  this_01 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&view;
  gimage::View::View((View *)this_01);
  gimage::loadView((View *)this_01,name,spath,verbose);
  local_184 = local_38;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&line0,name,(allocator *)&line1);
  gutil::split((vector *)&list,(string *)&line0,',',true);
  std::__cxx11::string::~string((string *)&line0);
  lVar21 = 0x20;
  for (uVar18 = 1;
      uVar18 < (ulong)((long)list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar18 = uVar18 + 1) {
    iVar13 = std::__cxx11::string::compare
                       ((long)&((list.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar21,0,(char *)0x2);
    if (iVar13 == 0) {
      std::__cxx11::string::substr
                ((ulong)&line0,
                 (long)&((list.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar21);
      dVar26 = atof((char *)CONCAT44(line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
      local_184 = (float)dVar26;
      std::__cxx11::string::~string((string *)&line0);
    }
    lVar21 = lVar21 + 0x20;
  }
  uVar18 = 0;
  for (lVar21 = 0; lVar21 < local_68; lVar21 = lVar21 + 1) {
    for (lVar22 = 0; lVar22 < (long)local_70; lVar22 = lVar22 + 1) {
      bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid(local_78,lVar22,lVar21);
      uVar18 = (ulong)((int)uVar18 + (uint)bVar11);
    }
  }
  if ((local_a8 < 1) || (local_a0 < 1)) {
    this = (ColoredMesh *)operator_new(0xc0);
    Mesh::Mesh((Mesh *)this);
    (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,uVar18,1);
    goto LAB_00116afe;
  }
  this = (ColoredMesh *)operator_new(200);
  ColoredMesh::ColoredMesh(this);
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[9])(this,uVar18,1);
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&line0,0,0,1);
  iVar13 = (int)((long)(local_a8 + local_70 + -1) / (long)local_70);
  if (iVar13 < 2) {
    if ((local_a8 < (long)local_70) || (local_a0 < local_68)) {
      gimage::resizeImageBilinear<unsigned_char>
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&line1,
                 (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&view,local_70,
                 local_68);
      goto LAB_001169c9;
    }
  }
  else {
    gimage::downscaleImage<unsigned_char>
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&line1,
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&view,iVar13);
LAB_001169c9:
    piVar8 = line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar7 = line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    uVar6 = line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_;
    line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = line1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_;
    line1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = uVar6;
    line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         line1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         line1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    line1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         piVar7;
    line1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piVar8;
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&line1);
    this_01 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&line0;
  }
  iVar13 = 0;
  for (lVar21 = 0; lVar21 < this_01->height; lVar21 = lVar21 + 1) {
    for (lVar22 = 0; lVar22 < this_01->width; lVar22 = lVar22 + 1) {
      bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid(local_78,lVar22,lVar21);
      if (bVar11) {
        iVar19 = this_01->depth;
        lVar23 = (long)iVar13 * 3;
        this->rgb[lVar23] = (*this_01->img)[lVar21][lVar22];
        if (iVar19 == 3) {
          this->rgb[lVar23 + 1] = this_01->img[1][lVar21][lVar22];
          pppuVar15 = this_01->img + 2;
        }
        else {
          this->rgb[lVar23 + 1] = (*this_01->img)[lVar21][lVar22];
          pppuVar15 = this_01->img;
        }
        this->rgb[lVar23 + 2] = (*pppuVar15)[lVar21][lVar22];
        iVar13 = iVar13 + 1;
      }
    }
  }
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&line0);
LAB_00116afe:
  gmath::SVector<double,_3>::operator=
            (&(this->super_Mesh).super_PointCloud.super_Model.origin,
             (SVector<double,_3> *)(local_40 + 0x10));
  cVar12 = (**(code **)(*local_40 + 0x18))(local_40);
  if (cVar12 != '\0') {
    gmath::SVector<double,_3>::SVector((SVector<double,_3> *)&line0);
    Model::setDefCameraRT((Model *)this,(Matrix33d *)(local_40 + 7),(Vector3d *)&line0);
  }
  iVar13 = 0;
  for (lVar21 = 0; lVar21 < local_68; lVar21 = lVar21 + 1) {
    for (lVar22 = 0; lVar22 < (long)local_70; lVar22 = lVar22 + 1) {
      bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid(local_78,lVar22,lVar21);
      if (bVar11) {
        p.v[0] = (double)lVar22 + 0.5;
        dVar26 = (double)*(float *)(*(long *)(*local_48 + lVar21 * 8) + lVar22 * 4);
        p.v[1] = (double)lVar21 + 0.5;
        gmath::SVector<double,_3>::SVector((SVector<double,_3> *)&line0);
        gmath::SVector<double,_3>::SVector((SVector<double,_3> *)&line1);
        (**(code **)(*local_40 + 0x40))(dVar26,local_40,&line0,&p);
        pfVar2 = (this->super_Mesh).super_PointCloud.vertex;
        lVar23 = (long)(iVar13 * 3);
        pfVar2[lVar23] =
             (float)((double)CONCAT44(line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) -
                    (double)local_40[0x10]);
        pfVar2[lVar23 + 1] =
             (float)((double)line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (double)local_40[0x11]);
        pfVar2[lVar23 + 2] =
             (float)((double)line0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage - (double)local_40[0x12]);
        p.v[0] = p.v[0] + 0.5;
        p.v[1] = p.v[1] + 0.5;
        (**(code **)(*local_40 + 0x40))(dVar26,local_40,&line1,&p);
        gmath::SVector<double,_3>::operator-
                  ((SVector<double,_3> *)f,(SVector<double,_3> *)&line1,(SVector<double,_3> *)&line0
                  );
        dVar27 = gmath::norm<double,3>((SVector<double,_3> *)f);
        (this->super_Mesh).super_PointCloud.scanprop[lVar23] = (float)(dVar27 + dVar27);
        p.v[0] = p.v[0] + -0.5;
        p.v[1] = p.v[1] + -0.5;
        (**(code **)(*local_40 + 0x40))(dVar26 + 0.5,local_40,&line1,&p);
        gmath::SVector<double,_3>::operator-
                  ((SVector<double,_3> *)f,(SVector<double,_3> *)&line1,(SVector<double,_3> *)&line0
                  );
        dVar26 = gmath::norm<double,3>((SVector<double,_3> *)f);
        pfVar2 = (this->super_Mesh).super_PointCloud.scanprop;
        pfVar2[lVar23 + 1] = (float)dVar26;
        pfVar2[lVar23 + 2] = 1.0;
        pfVar2 = (this->super_Mesh).super_PointCloud.scanpos;
        pfVar2[lVar23] = 0.0;
        pfVar2[lVar23 + 1] = 0.0;
        pfVar2[lVar23 + 2] = 0.0;
        iVar13 = iVar13 + 1;
      }
    }
  }
  for (lVar21 = 1; lVar21 < local_68; lVar21 = lVar21 + 1) {
    for (lVar22 = 1; lVar22 < (long)local_70; lVar22 = lVar22 + 1) {
      fVar5 = -3.4028235e+38;
      fVar4 = 3.4028235e+38;
      for (lVar23 = 0; lVar23 != 2; lVar23 = lVar23 + 1) {
        i_00 = lVar22;
        for (lVar16 = -8; lVar16 != 0; lVar16 = lVar16 + 4) {
          bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                             (local_78,i_00,lVar21 - lVar23);
          fVar1 = fVar5;
          if (bVar11) {
            fVar1 = *(float *)(*(long *)(*local_48 + (lVar21 - lVar23) * 8) + i_00 * 4);
            fVar28 = fVar1;
            if (fVar4 <= fVar1) {
              fVar28 = fVar4;
            }
            fVar4 = fVar28;
            if (fVar1 <= fVar5) {
              fVar1 = fVar5;
            }
          }
          fVar5 = fVar1;
          i_00 = i_00 + -1;
        }
      }
    }
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[10])(this);
  std::vector<int,_std::allocator<int>_>::vector(&line0,local_70,(allocator_type *)&line1);
  std::vector<int,_std::allocator<int>_>::vector(&line1,local_70,(allocator_type *)f);
  iVar13 = 0;
  for (sVar24 = 0; (long)sVar24 < (long)local_70; sVar24 = sVar24 + 1) {
    pvVar14 = std::vector<int,_std::allocator<int>_>::at(&line1,sVar24);
    *pvVar14 = -1;
    bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid(local_78,sVar24,0);
    if (bVar11) {
      pvVar14 = std::vector<int,_std::allocator<int>_>::at(&line1,sVar24);
      *pvVar14 = iVar13;
      iVar13 = iVar13 + 1;
    }
  }
  iVar19 = 0;
  pvVar9 = &line0;
  local_178 = &line1;
  for (lVar21 = 1; this_00 = pvVar9, lVar21 < local_68; lVar21 = lVar21 + 1) {
    pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,0);
    *pvVar14 = -1;
    bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid(local_78,0,lVar21);
    if (bVar11) {
      pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,0);
      *pvVar14 = iVar13;
      iVar13 = iVar13 + 1;
    }
    for (sVar24 = 1; (long)sVar24 < (long)local_70; sVar24 = sVar24 + 1) {
      pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar24);
      *pvVar14 = -1;
      bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid(local_78,sVar24,lVar21);
      if (bVar11) {
        pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar24);
        *pvVar14 = iVar13;
        iVar13 = iVar13 + 1;
      }
      fVar4 = 3.4028235e+38;
      fVar5 = -3.4028235e+38;
      iVar20 = 0;
      for (lVar22 = 0; lVar22 != 2; lVar22 = lVar22 + 1) {
        sVar17 = sVar24;
        for (lVar23 = -8; lVar23 != 0; lVar23 = lVar23 + 4) {
          bVar11 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                             (local_78,sVar17,lVar21 - lVar22);
          if (bVar11) {
            fVar1 = *(float *)(*(long *)(*local_48 + (lVar21 - lVar22) * 8) + sVar17 * 4);
            fVar28 = fVar1;
            if (fVar4 <= fVar1) {
              fVar28 = fVar4;
            }
            if (fVar1 <= fVar5) {
              fVar1 = fVar5;
            }
            iVar20 = iVar20 + 1;
            fVar4 = fVar28;
            fVar5 = fVar1;
          }
          sVar17 = sVar17 - 1;
        }
      }
      iVar10 = iVar19;
      if ((2 < iVar20) && (fVar5 - fVar4 <= local_184)) {
        sVar17 = sVar24 - 1;
        pvVar14 = std::vector<int,_std::allocator<int>_>::at(local_178,sVar17);
        bVar11 = -1 < *pvVar14;
        if (bVar11) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::at(local_178,sVar17);
          f[0] = *pvVar14;
        }
        pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar17);
        uVar18 = (ulong)bVar11;
        if (-1 < *pvVar14) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar17);
          uVar18 = (ulong)(bVar11 + 1);
          f[bVar11] = *pvVar14;
        }
        pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar24);
        uVar25 = uVar18;
        if (-1 < *pvVar14) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::at(this_00,sVar24);
          uVar25 = (ulong)((int)uVar18 + 1);
          f[uVar18] = *pvVar14;
        }
        iVar20 = (int)uVar25;
        pvVar14 = std::vector<int,_std::allocator<int>_>::at(local_178,sVar24);
        if (-1 < *pvVar14) {
          pvVar14 = std::vector<int,_std::allocator<int>_>::at(local_178,sVar24);
          iVar20 = iVar20 + 1;
          f[uVar25] = *pvVar14;
        }
        puVar3 = (this->super_Mesh).triangle;
        *(ulong *)(puVar3 + iVar19 * 3) = CONCAT44(f[1],f[0]);
        puVar3[(long)(iVar19 * 3) + 2] = f[2];
        iVar10 = iVar19 + 1;
        if (iVar20 == 4) {
          lVar22 = (long)((iVar19 + 1) * 3);
          puVar3[lVar22] = f[2];
          puVar3[lVar22 + 1] = f[3];
          puVar3[lVar22 + 2] = f[0];
          iVar10 = iVar19 + 2;
        }
      }
      iVar19 = iVar10;
    }
    pvVar9 = local_178;
    local_178 = this_00;
  }
  Mesh::recalculateNormals(&this->super_Mesh);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&line1.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&line0.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  gimage::View::~View(&view);
  return (Model *)this;
}

Assistant:

Model *loadDepth(const char *name, const char *spath, bool verbose)
{
  // load view

  gimage::View view;
  loadView(view, name, spath, verbose);

  // read optional maximum step size parameter

  float dstep=view.getDepthStep();

  std::vector<std::string> list;
  gutil::split(list, name, ',');

  for (size_t i=1; i<list.size(); i++)
  {
    if (list[i].compare(0, 2, "s=") == 0)
    {
      dstep=static_cast<float>(atof(list[i].substr(2).c_str()));
    }
  }

  // determine the number of valid points

  const gimage::ImageFloat &depth=view.getDepthImage();

  int n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        n++;
      }
    }
  }

  // create mesh

  Mesh *mesh=0;
  const gimage::ImageU8 *image=&view.getImage();

  if (image->getWidth() > 0 && image->getHeight() > 0)
  {
    ColoredMesh *cmesh=new ColoredMesh();
    cmesh->resizeVertexList(n, true, true);

    // resize image if required

    gimage::ImageU8 dsimage;

    {
      int ds=(image->getWidth()+depth.getWidth()-1)/depth.getWidth();

      if (ds > 1)
      {
        dsimage=gimage::downscaleImage(*image, ds);
        image=&dsimage;
      }
      else if (image->getWidth() < depth.getWidth() || image->getHeight() < depth.getHeight())
      {
        dsimage=gimage::resizeImageBilinear(*image, depth.getWidth(), depth.getHeight());
        image=&dsimage;
      }
    }

    // store colors

    n=0;

    for (long k=0; k<image->getHeight(); k++)
    {
      for (long i=0; i<image->getWidth(); i++)
      {
        if (depth.isValid(i, k))
        {
          if (image->getDepth() == 3)
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 1));
            cmesh->setColorComp(n, 2, image->get(i, k, 2));
          }
          else
          {
            cmesh->setColorComp(n, 0, image->get(i, k, 0));
            cmesh->setColorComp(n, 1, image->get(i, k, 0));
            cmesh->setColorComp(n, 2, image->get(i, k, 0));
          }

          n++;
        }
      }
    }

    mesh=cmesh;
  }
  else
  {
    mesh=new Mesh();
    mesh->resizeVertexList(n, true, true);
  }

  // reconstruct and store vertices

  const gmath::Camera *cam=view.getCamera();

  mesh->setOrigin(cam->getT());

  if (cam->isPerspective())
  {
    mesh->setDefCameraRT(cam->getR(), gmath::Vector3d());
  }

  n=0;

  for (long k=0; k<depth.getHeight(); k++)
  {
    for (long i=0; i<depth.getWidth(); i++)
    {
      if (depth.isValid(i, k))
      {
        gmath::Vector2d p(i+0.5, k+0.5);
        double   d=depth.get(i, k);
        gmath::Vector3d P, P2;

        cam->reconstructPoint(P, p, d);

        mesh->setVertexComp(n, 0, static_cast<float>(P[0]-cam->getT()[0]));
        mesh->setVertexComp(n, 1, static_cast<float>(P[1]-cam->getT()[1]));
        mesh->setVertexComp(n, 2, static_cast<float>(P[2]-cam->getT()[2]));

        p[0]+=0.5;
        p[1]+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanSize(n, static_cast<float>(2*norm(P2-P)));

        p[0]-=0.5;
        p[1]-=0.5;
        d+=0.5;

        cam->reconstructPoint(P2, p, d);
        mesh->setScanError(n, static_cast<float>(norm(P2-P)));
        mesh->setScanConf(n, 1.0f);

        mesh->setScanPosComp(n, 0, 0.0f);
        mesh->setScanPosComp(n, 1, 0.0f);
        mesh->setScanPosComp(n, 2, 0.0f);

        n++;
      }
    }
  }

  // count number of triangles

  int tn=0;

  for (long k=1; k<depth.getHeight(); k++)
  {
    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        tn+=valid-2;
      }
    }
  }

  mesh->resizeTriangleList(tn);

  // create triangles

  std::vector<int> line0(depth.getWidth());
  std::vector<int> line1(depth.getWidth());
  std::vector<int> *l0=&line0;
  std::vector<int> *l1=&line1;

  n=0;
  tn=0;

  for (long i=0; i<depth.getWidth(); i++)
  {
    l1->at(i)=-1;

    if (depth.isValid(i, 0))
    {
      l1->at(i)=n++;
    }
  }

  for (long k=1; k<depth.getHeight(); k++)
  {
    std::vector<int> *t=l0;
    l0=l1;
    l1=t;

    l1->at(0)=-1;

    if (depth.isValid(0, k))
    {
      l1->at(0)=n++;
    }

    for (long i=1; i<depth.getWidth(); i++)
    {
      float dmin=std::numeric_limits<float>::max();
      float dmax=-std::numeric_limits<float>::max();
      int   valid=0;

      l1->at(i)=-1;

      if (depth.isValid(i, k))
      {
        l1->at(i)=n++;
      }

      for (int kk=0; kk<2; kk++)
      {
        for (int ii=0; ii<2; ii++)
        {
          if (depth.isValid(i-ii, k-kk))
          {
            dmin=std::min(dmin, depth.get(i-ii, k-kk));
            dmax=std::max(dmax, depth.get(i-ii, k-kk));
            valid++;
          }
        }
      }

      if (valid >= 3 && dmax-dmin <= dstep)
      {
        int j=0;
        int f[4];

        if (l0->at(i-1) >= 0)
        {
          f[j++]=l0->at(i-1);
        }

        if (l1->at(i-1) >= 0)
        {
          f[j++]=l1->at(i-1);
        }

        if (l1->at(i) >= 0)
        {
          f[j++]=l1->at(i);
        }

        if (l0->at(i) >= 0)
        {
          f[j++]=l0->at(i);
        }

        mesh->setTriangleIndex(tn, 0, f[0]);
        mesh->setTriangleIndex(tn, 1, f[1]);
        mesh->setTriangleIndex(tn, 2, f[2]);
        tn++;

        if (j == 4)
        {
          mesh->setTriangleIndex(tn, 0, f[2]);
          mesh->setTriangleIndex(tn, 1, f[3]);
          mesh->setTriangleIndex(tn, 2, f[0]);
          tn++;
        }
      }
    }
  }

  // compute normals

  mesh->recalculateNormals();

  return mesh;
}